

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_gf100_2d.c
# Opt level: O0

void decode_gf100_2d_init(gpu_object *obj)

{
  addr_n_buf *buf;
  mthd2addr *addr;
  mthd2addr *tmp;
  gf100_2d_data *d;
  gpu_object *obj_local;
  
  buf = (addr_n_buf *)calloc(1,0x68);
  obj->class_data = buf;
  obj->class_data_destroy = destroy_gf100_2d_data;
  addr = (mthd2addr *)calloc(5,0x20);
  buf[4].address = (uint64_t)addr;
  m2a_set1(addr,0x10,0x14,buf);
  m2a_set1(addr + 1,0x104,0x108,buf + 1);
  m2a_set1(addr + 2,0x250,0x254,buf + 2);
  m2a_set1(addr + 3,0x220,0x224,buf + 3);
  m2a_set1(addr + 4,0,0,(addr_n_buf *)0x0);
  if ((long)((long)addr + (0xa0 - buf[4].address)) >> 5 == 5) {
    return;
  }
  __assert_fail("tmp - d->addresses == SZ",
                "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/demmt/object_gf100_2d.c"
                ,0x38,"void decode_gf100_2d_init(struct gpu_object *)");
}

Assistant:

void decode_gf100_2d_init(struct gpu_object *obj)
{
	struct gf100_2d_data *d = obj->class_data = calloc(1, sizeof(struct gf100_2d_data));
	obj->class_data_destroy = destroy_gf100_2d_data;

#define SZ 5
	struct mthd2addr *tmp = d->addresses = calloc(SZ, sizeof(*d->addresses));
	m2a_set1(tmp++, 0x0010, 0x0014, &d->subchan.semaphore);
	m2a_set1(tmp++, 0x0104, 0x0108, &d->graph.notify);
	m2a_set1(tmp++, 0x0250, 0x0254, &d->src);
	m2a_set1(tmp++, 0x0220, 0x0224, &d->dst);
	m2a_set1(tmp++, 0, 0, NULL);
	assert(tmp - d->addresses == SZ);
#undef SZ
}